

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_parsing.c
# Opt level: O0

int ecdsa_signature_parse_der_lax
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  secp256k1_context *ctx_00;
  long in_RCX;
  char *in_RDX;
  bool bVar5;
  bool bVar6;
  int overflow;
  uchar tmpsig [64];
  size_t lenbyte;
  size_t pos;
  size_t slen;
  size_t spos;
  size_t rlen;
  size_t rpos;
  undefined1 local_98 [32];
  undefined1 auStackY_78 [16];
  uchar *in_stack_ffffffffffffff98;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  secp256k1_fe *psVar7;
  long local_50;
  secp256k1_context *local_48;
  long local_40;
  ulong local_38;
  long local_30;
  int local_4;
  
  memset(local_98,0,0x40);
  bVar6 = false;
  secp256k1_ecdsa_signature_parse_compact
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((in_RCX == 0) || (*in_RDX != '0')) {
    local_4 = 0;
  }
  else if (in_RCX == 1) {
    local_4 = 0;
  }
  else {
    local_50 = 2;
    bVar1 = in_RDX[1];
    if ((bVar1 & 0x80) != 0) {
      if (in_RCX - 2U < (ulong)bVar1 - 0x80) {
        return 0;
      }
      local_50 = (ulong)bVar1 - 0x7e;
    }
    if ((local_50 == in_RCX) || (in_RDX[local_50] != '\x02')) {
      local_4 = 0;
    }
    else {
      lVar3 = local_50 + 1;
      if (lVar3 == in_RCX) {
        local_4 = 0;
      }
      else {
        local_50 = local_50 + 2;
        local_38 = (ulong)(byte)in_RDX[lVar3];
        if ((in_RDX[lVar3] & 0x80U) != 0) {
          uVar4 = local_38 - 0x80;
          if ((ulong)(in_RCX - local_50) < uVar4) {
            return 0;
          }
          while( true ) {
            bVar5 = false;
            if (uVar4 != 0) {
              bVar5 = in_RDX[local_50] == '\0';
            }
            if (!bVar5) break;
            local_50 = local_50 + 1;
            uVar4 = uVar4 - 1;
          }
          if (7 < uVar4) {
            return 0;
          }
          local_38 = 0;
          for (; uVar4 != 0; uVar4 = uVar4 - 1) {
            local_38 = local_38 * 0x100 + (ulong)(byte)in_RDX[local_50];
            local_50 = local_50 + 1;
          }
        }
        if ((ulong)(in_RCX - local_50) < local_38) {
          local_4 = 0;
        }
        else {
          local_30 = local_50;
          lVar3 = local_38 + local_50;
          if ((lVar3 == in_RCX) || (in_RDX[lVar3] != '\x02')) {
            local_4 = 0;
          }
          else if (lVar3 + 1 == in_RCX) {
            local_4 = 0;
          }
          else {
            local_50 = lVar3 + 2;
            ctx_00 = (secp256k1_context *)(ulong)(byte)in_RDX[lVar3 + 1];
            local_48 = ctx_00;
            if ((in_RDX[lVar3 + 1] & 0x80U) != 0) {
              psVar7 = &ctx_00[-1].ecmult_gen_ctx.ge_offset.y;
              if ((undefined1 *)(in_RCX - local_50) < psVar7) {
                return 0;
              }
              while( true ) {
                bVar5 = false;
                if (psVar7 != (secp256k1_fe *)0x0) {
                  bVar5 = in_RDX[local_50] == '\0';
                }
                if (!bVar5) break;
                local_50 = local_50 + 1;
                psVar7 = (secp256k1_fe *)((long)(((secp256k1_ge *)(psVar7 + -1))->x).n + 0x27);
              }
              if ((secp256k1_fe *)0x7 < psVar7) {
                return 0;
              }
              local_48 = (secp256k1_context *)0x0;
              for (; psVar7 != (secp256k1_fe *)0x0;
                  psVar7 = (secp256k1_fe *)((long)(((secp256k1_ge *)(psVar7 + -1))->x).n + 0x27)) {
                local_48 = (secp256k1_context *)
                           ((long)local_48 * 0x100 + (ulong)(byte)in_RDX[local_50]);
                local_50 = local_50 + 1;
              }
              ctx_00 = (secp256k1_context *)0x0;
            }
            if ((secp256k1_context *)(in_RCX - local_50) < local_48) {
              local_4 = 0;
            }
            else {
              local_40 = local_50;
              while( true ) {
                bVar5 = false;
                if (local_38 != 0) {
                  bVar5 = in_RDX[local_30] == '\0';
                }
                if (!bVar5) break;
                local_38 = local_38 - 1;
                local_30 = local_30 + 1;
              }
              if (local_38 < 0x21) {
                if (local_38 != 0) {
                  memcpy(auStackY_78 + -local_38,in_RDX + local_30,local_38);
                }
              }
              else {
                bVar6 = true;
              }
              while( true ) {
                bVar5 = false;
                if (local_48 != (secp256k1_context *)0x0) {
                  bVar5 = in_RDX[local_40] == '\0';
                }
                if (!bVar5) break;
                local_48 = (secp256k1_context *)&local_48[-1].field_0xcf;
                local_40 = local_40 + 1;
              }
              if (local_48 < (secp256k1_context *)0x21) {
                if (local_48 != (secp256k1_context *)0x0) {
                  memcpy(&stack0xffffffffffffffa8 + -(long)local_48,in_RDX + local_40,
                         (size_t)local_48);
                }
              }
              else {
                bVar6 = true;
              }
              if (!bVar6) {
                iVar2 = secp256k1_ecdsa_signature_parse_compact
                                  (ctx_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                bVar6 = iVar2 == 0;
              }
              if (bVar6) {
                memset(local_98,0,0x40);
                secp256k1_ecdsa_signature_parse_compact
                          (ctx_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
              }
              local_4 = 1;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ecdsa_signature_parse_der_lax(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else if (rlen) {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else if (slen) {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    if (overflow) {
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    return 1;
}